

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_dictionary_argument(vw *all,string *str)

{
  long *plVar1;
  undefined1 uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  ostream *poVar9;
  void *pvVar10;
  size_type sVar11;
  reference pvVar12;
  v_hashmap<substring,_features_*> *this;
  example *__ptr;
  features **ppfVar13;
  features *this_00;
  size_t sVar14;
  substring *in_RSI;
  long in_RDI;
  dictionary_info info;
  size_t i;
  features *arr;
  uint64_t hash;
  substring ss;
  char *word;
  char *d;
  char *c;
  stringstream __msg_3;
  char *new_buffer;
  char *buffer;
  char rc;
  ssize_t nread;
  ssize_t pos;
  ssize_t size;
  size_t def;
  example *ec;
  feature_dict *map;
  stringstream __msg_2;
  size_t id;
  uint64_t fd_hash;
  stringstream __msg_1;
  int fd;
  io_buf *io;
  bool is_gzip;
  stringstream __msg;
  string fname;
  char *s;
  char ns;
  features *in_stack_fffffffffffff5a8;
  char **ppcVar15;
  comp_io_buf *in_stack_fffffffffffff5b0;
  example *in_stack_fffffffffffff5b8;
  string *in_stack_fffffffffffff5c0;
  string *in_stack_fffffffffffff5c8;
  char *in_stack_fffffffffffff5d0;
  int iVar16;
  example *in_stack_fffffffffffff5d8;
  vw *in_stack_fffffffffffff5e0;
  size_t in_stack_fffffffffffff5e8;
  void *in_stack_fffffffffffff5f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff5f8;
  undefined7 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff607;
  long *local_8c0;
  undefined7 in_stack_fffffffffffff778;
  allocator *hash_00;
  substring *this_01;
  char *local_860;
  uint64_t local_858;
  v_hashmap<substring,_features_*> *local_850;
  ulong local_848;
  void *local_840;
  uint64_t local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 local_801;
  stringstream local_7e0 [16];
  stringstream local_7d0 [96];
  string *in_stack_fffffffffffff890;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff898;
  char *local_650;
  int in_stack_fffffffffffff9bc;
  char cVar17;
  io_buf *in_stack_fffffffffffff9c0;
  long local_638;
  size_t local_630;
  stringstream local_5e0 [16];
  ostream local_5d0;
  undefined4 local_454;
  ulong local_450;
  uint64_t local_448;
  undefined1 local_439;
  stringstream local_418 [16];
  ostream local_408;
  int local_290;
  undefined1 local_289;
  long *local_288;
  undefined1 local_279;
  long *local_278;
  long *local_270;
  allocator local_261;
  string local_260 [38];
  undefined1 local_23a;
  undefined1 local_239;
  stringstream local_218 [16];
  ostream local_208;
  allocator local_79;
  string local_78 [56];
  string local_40 [32];
  char *local_20;
  undefined1 local_11;
  long local_8;
  
  this_01 = in_RSI;
  local_8 = in_RDI;
  lVar4 = std::__cxx11::string::length();
  if (lVar4 != 0) {
    local_11 = 0x20;
    local_20 = (char *)std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::length();
    if ((2 < uVar5) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)this_01), *pcVar6 == ':')) {
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this_01);
      local_11 = *puVar7;
      local_20 = local_20 + 2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600),
             in_stack_fffffffffffff5f8);
    pcVar6 = local_20;
    hash_00 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar6,hash_00);
    find_in_path(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff5c0);
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff5b0,(char *)in_stack_fffffffffffff5a8);
    if ((bool)uVar2) {
      std::__cxx11::stringstream::stringstream(local_218);
      iVar16 = (int)((ulong)in_stack_fffffffffffff5d0 >> 0x20);
      poVar9 = std::operator<<(&local_208,"error: cannot find dictionary \'");
      poVar9 = std::operator<<(poVar9,local_20);
      std::operator<<(poVar9,"\' in path; try adding --dictionary_path");
      local_239 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,iVar16,
                 in_stack_fffffffffffff5c8);
      local_239 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,".gz",&local_261);
    bVar3 = ends_with(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    local_279 = 0;
    local_289 = 0;
    local_23a = bVar3;
    if (bVar3) {
      local_8c0 = (long *)operator_new(0xc0);
      local_279 = 1;
      local_278 = local_8c0;
      comp_io_buf::comp_io_buf(in_stack_fffffffffffff5b0);
    }
    else {
      local_8c0 = (long *)operator_new(0xa8);
      local_289 = 1;
      local_288 = local_8c0;
      io_buf::io_buf((io_buf *)0x165cd0);
    }
    local_270 = local_8c0;
    uVar8 = std::__cxx11::string::c_str();
    local_290 = (**(code **)*local_8c0)(local_8c0,uVar8,*(byte *)(local_8 + 0x3558) & 1,1);
    if (local_290 < 0) {
      std::__cxx11::stringstream::stringstream(local_418);
      iVar16 = (int)((ulong)in_stack_fffffffffffff5d0 >> 0x20);
      poVar9 = std::operator<<(&local_408,"error: cannot read dictionary from file \'");
      poVar9 = std::operator<<(poVar9,local_40);
      poVar9 = std::operator<<(poVar9,"\'");
      std::operator<<(poVar9,", opening failed");
      local_439 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,iVar16,
                 in_stack_fffffffffffff5c8);
      local_439 = 0;
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_448 = hash_file_contents(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    (**(code **)(*local_270 + 0x40))();
    if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
      poVar9 = std::operator<<((ostream *)(local_8 + 0xe0),"scanned dictionary \'");
      poVar9 = std::operator<<(poVar9,local_20);
      poVar9 = std::operator<<(poVar9,"\' from \'");
      poVar9 = std::operator<<(poVar9,local_40);
      poVar9 = std::operator<<(poVar9,"\', hash=");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
      pvVar10 = (void *)std::ostream::operator<<(pvVar10,local_448);
      pvVar10 = (void *)std::ostream::operator<<(pvVar10,std::dec);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
    for (local_450 = 0; uVar5 = local_450,
        sVar11 = std::vector<dictionary_info,_std::allocator<dictionary_info>_>::size
                           ((vector<dictionary_info,_std::allocator<dictionary_info>_> *)
                            (local_8 + 0x3418)), plVar1 = local_270, uVar5 < sVar11;
        local_450 = local_450 + 1) {
      pvVar12 = std::vector<dictionary_info,_std::allocator<dictionary_info>_>::operator[]
                          ((vector<dictionary_info,_std::allocator<dictionary_info>_> *)
                           (local_8 + 0x3418),local_450);
      if (pvVar12->file_hash == local_448) {
        std::vector<dictionary_info,_std::allocator<dictionary_info>_>::operator[]
                  ((vector<dictionary_info,_std::allocator<dictionary_info>_> *)(local_8 + 0x3418),
                   local_450);
        std::
        vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
        ::push_back((vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     *)in_stack_fffffffffffff5c0,(value_type *)in_stack_fffffffffffff5b8);
        (**(code **)(*local_270 + 0x40))();
        if (local_270 != (long *)0x0) {
          (**(code **)(*local_270 + 0x18))();
        }
        local_454 = 1;
        goto LAB_00166e1f;
      }
    }
    uVar8 = std::__cxx11::string::c_str();
    local_290 = (**(code **)*plVar1)(plVar1,uVar8,*(byte *)(local_8 + 0x3558) & 1,1);
    if (local_290 < 0) {
      if (local_270 != (long *)0x0) {
        (**(code **)(*local_270 + 0x18))();
      }
      iVar16 = (int)((ulong)in_stack_fffffffffffff5d0 >> 0x20);
      std::__cxx11::stringstream::stringstream(local_5e0);
      poVar9 = std::operator<<(&local_5d0,"error: cannot re-read dictionary from file \'");
      poVar9 = std::operator<<(poVar9,local_40);
      poVar9 = std::operator<<(poVar9,"\'");
      std::operator<<(poVar9,", opening failed");
      uVar8 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,iVar16,
                 in_stack_fffffffffffff5c8);
      __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    this = calloc_or_throw<v_hashmap<substring,features*>>();
    v_hashmap<substring,_features_*>::init(this,(EVP_PKEY_CTX *)0x3ff);
    __ptr = VW::alloc_examples((size_t)in_stack_fffffffffffff5b8,(size_t)in_stack_fffffffffffff5b0);
    local_630 = 0x800;
    local_650 = calloc_or_throw<char>(CONCAT17(uVar2,in_stack_fffffffffffff778));
    do {
      local_638 = 0;
      do {
        lVar4 = (**(code **)(*local_270 + 0x28))(local_270,local_290,&stack0xfffffffffffff9bf,1);
        cVar17 = (char)((uint)in_stack_fffffffffffff9bc >> 0x18);
        if ((cVar17 != -1) && (0 < lVar4)) {
          local_650[local_638] = cVar17;
          local_638 = local_638 + 1;
        }
        pcVar6 = local_650;
        if ((long)(local_630 - 1) <= local_638) {
          local_630 = local_630 << 1;
          pcVar6 = (char *)realloc(local_650,local_630);
          if (pcVar6 == (char *)0x0) {
            free(local_650);
            iVar16 = (int)((ulong)in_stack_fffffffffffff5d0 >> 0x20);
            free(__ptr);
            VW::dealloc_example((_func_void_void_ptr *)in_stack_fffffffffffff5c0,
                                in_stack_fffffffffffff5b8,
                                (_func_void_void_ptr *)in_stack_fffffffffffff5b0);
            if (this != (v_hashmap<substring,_features_*> *)0x0) {
              v_hashmap<substring,_features_*>::~v_hashmap
                        ((v_hashmap<substring,_features_*> *)0x166623);
              operator_delete(this);
            }
            (**(code **)(*local_270 + 0x40))();
            if (local_270 != (long *)0x0) {
              (**(code **)(*local_270 + 0x18))();
            }
            std::__cxx11::stringstream::stringstream(local_7e0);
            std::operator<<((ostream *)(local_7e0 + 0x10),
                            "error: memory allocation failed in reading dictionary");
            local_801 = 1;
            uVar8 = __cxa_allocate_exception(0x38);
            std::__cxx11::stringstream::str();
            VW::vw_exception::vw_exception
                      ((vw_exception *)in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8,
                       iVar16,in_stack_fffffffffffff5c8);
            local_801 = 0;
            __cxa_throw(uVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
        }
        local_650 = pcVar6;
        cVar17 = (char)((uint)in_stack_fffffffffffff9bc >> 0x18);
        bVar3 = false;
        if ((cVar17 != -1) && (bVar3 = false, cVar17 != '\n')) {
          bVar3 = 0 < lVar4;
        }
      } while (bVar3);
      local_650[local_638] = '\0';
      local_810 = local_650;
      while( true ) {
        bVar3 = true;
        if (*local_810 != ' ') {
          bVar3 = *local_810 == '\t';
        }
        if (!bVar3) break;
        local_810 = local_810 + 1;
      }
      local_818 = local_810;
      while( true ) {
        bVar3 = false;
        if (((*local_818 != ' ') && (bVar3 = false, *local_818 != '\t')) &&
           (bVar3 = false, *local_818 != '\n')) {
          bVar3 = *local_818 != '\0';
        }
        if (!bVar3) break;
        local_818 = local_818 + 1;
      }
      if ((local_818 != local_810) && ((*local_818 == ' ' || (*local_818 == '\t')))) {
        local_820 = calloc_or_throw<char>(CONCAT17(uVar2,in_stack_fffffffffffff778));
        memcpy(local_820,local_810,(long)local_818 - (long)local_810);
        local_830 = local_820;
        local_828 = local_820 + ((long)local_818 - (long)local_810);
        local_838 = uniform_hash(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                                 (uint64_t)in_stack_fffffffffffff5e0);
        ppfVar13 = v_hashmap<substring,_features_*>::get
                             ((v_hashmap<substring,_features_*> *)this_01,in_RSI,(uint64_t)hash_00);
        if (*ppfVar13 == (features *)0x0) {
          local_818 = local_818 + -1;
          *local_818 = '|';
          VW::read_line(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,
                        in_stack_fffffffffffff5d0);
          this_00 = (features *)features::size((features *)0x166a86);
          if (this_00 == (features *)0x0) {
            free(local_820);
          }
          else {
            pvVar10 = operator_new(0x68);
            features::features(this_00);
            local_840 = pvVar10;
            features::deep_copy_from
                      ((features *)in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
            v_hashmap<substring,_features_*>::put
                      ((v_hashmap<substring,_features_*> *)in_stack_fffffffffffff5c0,
                       (substring *)in_stack_fffffffffffff5b8,(uint64_t)in_stack_fffffffffffff5b0,
                       (features **)in_stack_fffffffffffff5a8);
            v_array<char>::clear((v_array<char> *)in_stack_fffffffffffff5b0);
            v_array<unsigned_char>::clear((v_array<unsigned_char> *)in_stack_fffffffffffff5b0);
            for (local_848 = 0; local_848 < 0x100; local_848 = local_848 + 1) {
              features::clear((features *)in_stack_fffffffffffff5b0);
            }
          }
        }
        else {
          free(local_820);
        }
      }
    } while ((char)((uint)in_stack_fffffffffffff9bc >> 0x18) != -1 && 0 < lVar4);
    free(local_650);
    (**(code **)(*local_270 + 0x40))();
    if (local_270 != (long *)0x0) {
      (**(code **)(*local_270 + 0x18))();
    }
    VW::dealloc_example((_func_void_void_ptr *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                        (_func_void_void_ptr *)in_stack_fffffffffffff5b0);
    free(__ptr);
    if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
      poVar9 = std::operator<<((ostream *)(local_8 + 0xe0),"dictionary ");
      poVar9 = std::operator<<(poVar9,local_20);
      poVar9 = std::operator<<(poVar9," contains ");
      sVar14 = v_hashmap<substring,_features_*>::size(this);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar14);
      poVar9 = std::operator<<(poVar9," item");
      in_stack_fffffffffffff5c0 = (string *)v_hashmap<substring,_features_*>::size(this);
      pcVar6 = "s";
      if (in_stack_fffffffffffff5c0 == (string *)0x1) {
        pcVar6 = "";
      }
      in_stack_fffffffffffff5b8 = (example *)std::operator<<(poVar9,pcVar6);
      std::ostream::operator<<(in_stack_fffffffffffff5b8,std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
    ::push_back((vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                 *)in_stack_fffffffffffff5c0,(value_type *)in_stack_fffffffffffff5b8);
    ppcVar15 = &local_860;
    strlen(local_20);
    pcVar6 = calloc_or_throw<char>(CONCAT17(uVar2,in_stack_fffffffffffff778));
    *ppcVar15 = pcVar6;
    local_858 = local_448;
    local_850 = this;
    strcpy(local_860,local_20);
    std::vector<dictionary_info,_std::allocator<dictionary_info>_>::push_back
              ((vector<dictionary_info,_std::allocator<dictionary_info>_> *)
               in_stack_fffffffffffff5c0,(value_type *)in_stack_fffffffffffff5b8);
    local_454 = 0;
LAB_00166e1f:
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void parse_dictionary_argument(vw& all, string str)
{
  if (str.length() == 0)
    return;
  // expecting 'namespace:file', for instance 'w:foo.txt'
  // in the case of just 'foo.txt' it's applied to the default namespace

  char ns = ' ';
  const char* s = str.c_str();
  if ((str.length() > 2) && (str[1] == ':'))
  {
    ns = str[0];
    s += 2;
  }

  string fname = find_in_path(all.dictionary_path, string(s));
  if (fname == "")
    THROW("error: cannot find dictionary '" << s << "' in path; try adding --dictionary_path");

  bool is_gzip = ends_with(fname, ".gz");
  io_buf* io = is_gzip ? new comp_io_buf : new io_buf;
  int fd = io->open_file(fname.c_str(), all.stdin_off, io_buf::READ);
  if (fd < 0)
    THROW("error: cannot read dictionary from file '" << fname << "'"
                                                      << ", opening failed");

  uint64_t fd_hash = hash_file_contents(io, fd);
  io->close_file();

  if (!all.quiet)
    all.trace_message << "scanned dictionary '" << s << "' from '" << fname << "', hash=" << hex << fd_hash << dec
                      << endl;

  // see if we've already read this dictionary
  for (size_t id = 0; id < all.loaded_dictionaries.size(); id++)
    if (all.loaded_dictionaries[id].file_hash == fd_hash)
    {
      all.namespace_dictionaries[(size_t)ns].push_back(all.loaded_dictionaries[id].dict);
      io->close_file();
      delete io;
      return;
    }

  fd = io->open_file(fname.c_str(), all.stdin_off, io_buf::READ);
  if (fd < 0)
  {
    delete io;
    THROW("error: cannot re-read dictionary from file '" << fname << "'"
                                                         << ", opening failed");
  }

  feature_dict* map = &calloc_or_throw<feature_dict>();
  map->init(1023, nullptr, substring_equal);
  example* ec = VW::alloc_examples(all.p->lp.label_size, 1);

  size_t def = (size_t)' ';

  ssize_t size = 2048, pos, nread;
  char rc;
  char* buffer = calloc_or_throw<char>(size);
  do
  {
    pos = 0;
    do
    {
      nread = io->read_file(fd, &rc, 1);
      if ((rc != EOF) && (nread > 0))
        buffer[pos++] = rc;
      if (pos >= size - 1)
      {
        size *= 2;
        const auto new_buffer = (char*)(realloc(buffer, size));
        if (new_buffer == nullptr)
        {
          free(buffer);
          free(ec);
          VW::dealloc_example(all.p->lp.delete_label, *ec);
          delete map;
          io->close_file();
          delete io;
          THROW("error: memory allocation failed in reading dictionary");
        }
        else
          buffer = new_buffer;
      }
    } while ((rc != EOF) && (rc != '\n') && (nread > 0));
    buffer[pos] = 0;

    // we now have a line in buffer
    char* c = buffer;
    while (*c == ' ' || *c == '\t') ++c;  // skip initial whitespace
    char* d = c;
    while (*d != ' ' && *d != '\t' && *d != '\n' && *d != '\0') ++d;  // gobble up initial word
    if (d == c)
      continue;  // no word
    if (*d != ' ' && *d != '\t')
      continue;  // reached end of line
    char* word = calloc_or_throw<char>(d - c);
    memcpy(word, c, d - c);
    substring ss = {word, word + (d - c)};
    uint64_t hash = uniform_hash(ss.begin, ss.end - ss.begin, quadratic_constant);
    if (map->get(ss, hash) != nullptr)  // don't overwrite old values!
    {
      free(word);
      continue;
    }
    d--;
    *d = '|';  // set up for parser::read_line
    VW::read_line(all, ec, d);
    // now we just need to grab stuff from the default namespace of ec!
    if (ec->feature_space[def].size() == 0)
    {
      free(word);
      continue;
    }
    features* arr = new features;
    arr->deep_copy_from(ec->feature_space[def]);
    map->put(ss, hash, arr);

    // clear up ec
    ec->tag.clear();
    ec->indices.clear();
    for (size_t i = 0; i < 256; i++)
    {
      ec->feature_space[i].clear();
    }
  } while ((rc != EOF) && (nread > 0));
  free(buffer);
  io->close_file();
  delete io;
  VW::dealloc_example(all.p->lp.delete_label, *ec);
  free(ec);

  if (!all.quiet)
    all.trace_message << "dictionary " << s << " contains " << map->size() << " item" << (map->size() == 1 ? "" : "s")
                      << endl;

  all.namespace_dictionaries[(size_t)ns].push_back(map);
  dictionary_info info = {calloc_or_throw<char>(strlen(s) + 1), fd_hash, map};
  strcpy(info.name, s);
  all.loaded_dictionaries.push_back(info);
}